

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

bool __thiscall
libcellml::Variable::VariableImpl::setEquivalentTo
          (VariableImpl *this,VariablePtr *equivalentVariable)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  const_iterator cVar4;
  bool bVar5;
  VariableWeakPtr weakEquivalentVariable;
  value_type local_28;
  
  cleanExpiredVariables(this);
  cVar4 = findEquivalentVariable(this,equivalentVariable);
  if ((cVar4._M_current ==
       (this->mEquivalentVariables).
       super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (p_Var2 = ((cVar4._M_current)->
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi,
     p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    bVar5 = false;
  }
  else {
    bVar5 = p_Var2->_M_use_count != 0;
  }
  if (bVar5 == false) {
    local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (equivalentVariable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (equivalentVariable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        (local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count =
             (local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi)->_M_weak_count + 1;
      }
    }
    std::
    vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
    ::push_back(&this->mEquivalentVariables,&local_28);
    if (local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &(local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_weak_count;
        iVar3 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar3 = (local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
        (local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_weak_count = iVar3 + -1;
      }
      if (iVar3 == 1) {
        (*(local_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_vptr__Sp_counted_base[3])();
      }
    }
  }
  return (bool)(bVar5 ^ 1);
}

Assistant:

bool Variable::VariableImpl::setEquivalentTo(const VariablePtr &equivalentVariable)
{
    cleanExpiredVariables();
    if (!hasEquivalentVariable(equivalentVariable)) {
        VariableWeakPtr weakEquivalentVariable = equivalentVariable;
        mEquivalentVariables.push_back(weakEquivalentVariable);
        return true;
    }

    return false;
}